

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::ClearFreeMemory(ImDrawList *this)

{
  ImDrawCmd *ptr;
  unsigned_short *ptr_00;
  ImDrawVert *ptr_01;
  ImVec4 *ptr_02;
  void **ptr_03;
  ImVec2 *ptr_04;
  ImDrawChannel *pIVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  ptr = (this->CmdBuffer).Data;
  if (ptr != (ImDrawCmd *)0x0) {
    (this->CmdBuffer).Size = 0;
    (this->CmdBuffer).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->CmdBuffer).Data = (ImDrawCmd *)0x0;
  }
  ptr_00 = (this->IdxBuffer).Data;
  if (ptr_00 != (unsigned_short *)0x0) {
    (this->IdxBuffer).Size = 0;
    (this->IdxBuffer).Capacity = 0;
    ImGui::MemFree(ptr_00);
    (this->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  ptr_01 = (this->VtxBuffer).Data;
  if (ptr_01 != (ImDrawVert *)0x0) {
    (this->VtxBuffer).Size = 0;
    (this->VtxBuffer).Capacity = 0;
    ImGui::MemFree(ptr_01);
    (this->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  ptr_02 = (this->_ClipRectStack).Data;
  if (ptr_02 != (ImVec4 *)0x0) {
    (this->_ClipRectStack).Size = 0;
    (this->_ClipRectStack).Capacity = 0;
    ImGui::MemFree(ptr_02);
    (this->_ClipRectStack).Data = (ImVec4 *)0x0;
  }
  ptr_03 = (this->_TextureIdStack).Data;
  if (ptr_03 != (void **)0x0) {
    (this->_TextureIdStack).Size = 0;
    (this->_TextureIdStack).Capacity = 0;
    ImGui::MemFree(ptr_03);
    (this->_TextureIdStack).Data = (void **)0x0;
  }
  ptr_04 = (this->_Path).Data;
  if (ptr_04 != (ImVec2 *)0x0) {
    (this->_Path).Size = 0;
    (this->_Path).Capacity = 0;
    ImGui::MemFree(ptr_04);
    (this->_Path).Data = (ImVec2 *)0x0;
  }
  this->_ChannelsCurrent = 0;
  this->_ChannelsCount = 1;
  if (0 < (this->_Channels).Size) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (lVar4 == 0) {
        pIVar1 = (this->_Channels).Data;
        (pIVar1->IdxBuffer).Size = 0;
        (pIVar1->IdxBuffer).Capacity = 0;
        (pIVar1->IdxBuffer).Data = (unsigned_short *)0x0;
        (pIVar1->CmdBuffer).Size = 0;
        (pIVar1->CmdBuffer).Capacity = 0;
        (pIVar1->CmdBuffer).Data = (ImDrawCmd *)0x0;
      }
      pIVar1 = (this->_Channels).Data;
      pvVar2 = *(void **)((long)&(pIVar1->CmdBuffer).Data + lVar4);
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar1->CmdBuffer).Size + lVar4) = 0;
        ImGui::MemFree(pvVar2);
        *(undefined8 *)((long)&(pIVar1->CmdBuffer).Data + lVar4) = 0;
      }
      pIVar1 = (this->_Channels).Data;
      pvVar2 = *(void **)((long)&(pIVar1->IdxBuffer).Data + lVar4);
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar1->IdxBuffer).Size + lVar4) = 0;
        ImGui::MemFree(pvVar2);
        *(undefined8 *)((long)&(pIVar1->IdxBuffer).Data + lVar4) = 0;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar3 < (this->_Channels).Size);
  }
  pIVar1 = (this->_Channels).Data;
  if (pIVar1 != (ImDrawChannel *)0x0) {
    (this->_Channels).Size = 0;
    (this->_Channels).Capacity = 0;
    ImGui::MemFree(pIVar1);
    (this->_Channels).Data = (ImDrawChannel *)0x0;
  }
  return;
}

Assistant:

void ImDrawList::ClearFreeMemory()
{
    CmdBuffer.clear();
    IdxBuffer.clear();
    VtxBuffer.clear();
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.clear();
    _TextureIdStack.clear();
    _Path.clear();
    _ChannelsCurrent = 0;
    _ChannelsCount = 1;
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == 0) memset(&_Channels[0], 0, sizeof(_Channels[0]));  // channel 0 is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i].CmdBuffer.clear();
        _Channels[i].IdxBuffer.clear();
    }
    _Channels.clear();
}